

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

void __thiscall
FOptionMenuSliderBase::FOptionMenuSliderBase
          (FOptionMenuSliderBase *this,char *label,double min,double max,double step,int showval)

{
  FName local_14;
  
  local_14.Index = 0;
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_14,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItem_006e6e28;
  this->mMin = min;
  this->mMax = max;
  this->mStep = step;
  this->mShowValue = showval;
  this->mDrawX = 0;
  this->mSliderShort = 0;
  return;
}

Assistant:

FOptionMenuSliderBase(const char *label, double min, double max, double step, int showval)
		: FOptionMenuItem(label, NAME_None)
	{
		mMin = min;
		mMax = max;
		mStep = step;
		mShowValue = showval;
		mDrawX = 0;
		mSliderShort = 0;
	}